

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O2

bool __thiscall SQGenerator::Resume(SQGenerator *this,SQVM *v,SQObjectPtr *dest)

{
  SQUnsignedInteger *pSVar1;
  SQExceptionTrap *pSVar2;
  SQUnsignedInteger SVar3;
  SQObjectPtr *pSVar4;
  CallInfo *pCVar5;
  SQExceptionTrap *pSVar6;
  SQUnsignedInteger SVar7;
  long lVar8;
  bool bVar9;
  int iVar10;
  char *s;
  SQObject *obj;
  SQInteger n;
  long lVar11;
  long lVar12;
  SQObject _this;
  
  if (this->_state == eRunning) {
    s = "resuming active generator";
  }
  else {
    if (this->_state != eDead) {
      SVar3 = (this->_stack)._size;
      pSVar4 = (v->_stack)._vals;
      lVar12 = v->_top;
      lVar11 = v->_stackbase;
      bVar9 = SQVM::EnterFrame(v,lVar12,lVar12 + SVar3,false);
      if (!bVar9) {
        return false;
      }
      pCVar5 = v->ci;
      pCVar5->_generator = this;
      pCVar5->_target = (SQInt32)((ulong)((long)dest - (long)(pSVar4 + lVar11)) >> 4);
      SQObjectPtr::operator=(&pCVar5->_closure,&(this->_ci)._closure);
      pCVar5 = v->ci;
      pSVar4 = (this->_ci)._literals;
      pCVar5->_ip = (this->_ci)._ip;
      pCVar5->_literals = pSVar4;
      pCVar5->_ncalls = (this->_ci)._ncalls;
      iVar10 = (this->_ci)._etraps;
      pCVar5->_etraps = iVar10;
      pCVar5->_root = (this->_ci)._root;
      for (lVar11 = 0; lVar11 < iVar10; lVar11 = lVar11 + 1) {
        sqvector<SQExceptionTrap>::push_back
                  (&v->_etraps,(this->_etraps)._vals + ((this->_etraps)._size - 1));
        pSVar1 = &(this->_etraps)._size;
        *pSVar1 = *pSVar1 - 1;
        pSVar6 = (v->_etraps)._vals;
        SVar7 = (v->_etraps)._size;
        pSVar2 = pSVar6 + (SVar7 - 1);
        lVar8 = pSVar2->_stacksize;
        pSVar6 = pSVar6 + (SVar7 - 1);
        pSVar6->_stackbase = pSVar2->_stackbase + lVar12;
        pSVar6->_stacksize = lVar8 + lVar12;
        iVar10 = (this->_ci)._etraps;
      }
      pSVar4 = (this->_stack)._vals;
      _this._type = (pSVar4->super_SQObject)._type;
      _this._4_4_ = *(undefined4 *)&(pSVar4->super_SQObject).field_0x4;
      _this._unVal = (SQObjectValue)(pSVar4->super_SQObject)._unVal.pWeakRef;
      obj = &(_this._unVal.pWeakRef)->_obj;
      if (_this._type != OT_WEAKREF) {
        obj = &_this;
      }
      SQObjectPtr::operator=((v->_stack)._vals + v->_stackbase,obj);
      lVar11 = 0x10;
      for (lVar12 = 1; lVar12 < (long)SVar3; lVar12 = lVar12 + 1) {
        SQObjectPtr::operator=
                  ((SQObjectPtr *)
                   ((long)&(v->_stack)._vals[v->_stackbase].super_SQObject._type + lVar11),
                   (SQObjectPtr *)((long)&(((this->_stack)._vals)->super_SQObject)._type + lVar11));
        SQObjectPtr::Null((SQObjectPtr *)
                          ((long)&(((this->_stack)._vals)->super_SQObject)._type + lVar11));
        lVar11 = lVar11 + 0x10;
      }
      this->_state = eRunning;
      if (v->_debughook != false) {
        SQVM::CallDebugHook(v,99,0);
      }
      return true;
    }
    s = "resuming dead generator";
  }
  SQVM::Raise_Error(v,s);
  return false;
}

Assistant:

bool SQGenerator::Resume(SQVM *v,SQObjectPtr &dest)
{
    if(_state==eDead){ v->Raise_Error(_SC("resuming dead generator")); return false; }
    if(_state==eRunning){ v->Raise_Error(_SC("resuming active generator")); return false; }
    SQInteger size = _stack.size();
    SQInteger target = &dest - &(v->_stack._vals[v->_stackbase]);
    assert(target>=0 && target<=255);
    SQInteger newbase = v->_top;
    if(!v->EnterFrame(v->_top, v->_top + size, false))
        return false;
    v->ci->_generator   = this;
    v->ci->_target      = (SQInt32)target;
    v->ci->_closure     = _ci._closure;
    v->ci->_ip          = _ci._ip;
    v->ci->_literals    = _ci._literals;
    v->ci->_ncalls      = _ci._ncalls;
    v->ci->_etraps      = _ci._etraps;
    v->ci->_root        = _ci._root;


    for(SQInteger i=0;i<_ci._etraps;i++) {
        v->_etraps.push_back(_etraps.top());
        _etraps.pop_back();
        SQExceptionTrap &et = v->_etraps.back();
        // restore absolute stack base and size
        et._stackbase += newbase;
        et._stacksize += newbase;
    }
    SQObject _this = _stack._vals[0];
    v->_stack[v->_stackbase] = type(_this) == OT_WEAKREF ? _weakref(_this)->_obj : _this;

    for(SQInteger n = 1; n<size; n++) {
        v->_stack[v->_stackbase+n] = _stack._vals[n];
        _stack._vals[n].Null();
    }

    _state=eRunning;
    if (v->_debughook)
        v->CallDebugHook(_SC('c'));

    return true;
}